

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

void __thiscall
vkt::synchronization::anon_unknown_0::FillUpdateBuffer::Implementation::Implementation
          (Implementation *this,OperationContext *context,Resource *resource,BufferOp bufferOp)

{
  BufferResource *pBVar1;
  size_type sVar2;
  reference pvVar3;
  uint local_4c;
  deUint32 i;
  deUint32 *pData;
  size_t size;
  BufferOp bufferOp_local;
  Resource *resource_local;
  OperationContext *context_local;
  Implementation *this_local;
  
  Operation::Operation(&this->super_Operation);
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__Implementation_0166f988;
  this->m_context = context;
  this->m_resource = resource;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_data);
  this->m_fillValue = 0x13;
  this->m_bufferOp = bufferOp;
  pBVar1 = Resource::getBuffer(this->m_resource);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->m_data,pBVar1->size);
  if (this->m_bufferOp == BUFFER_OP_FILL) {
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_data);
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&this->m_data,0)
    ;
    for (local_4c = 0; (ulong)local_4c < sVar2 >> 2; local_4c = local_4c + 1) {
      *(deUint32 *)(pvVar3 + (ulong)local_4c * 4) = this->m_fillValue;
    }
  }
  else if (this->m_bufferOp == BUFFER_OP_UPDATE) {
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&this->m_data,0)
    ;
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_data);
    fillPattern(pvVar3,sVar2);
  }
  return;
}

Assistant:

Implementation (OperationContext& context, Resource& resource, const BufferOp bufferOp)
		: m_context		(context)
		, m_resource	(resource)
		, m_fillValue	(0x13)
		, m_bufferOp	(bufferOp)
	{
		DE_ASSERT((m_resource.getBuffer().size % sizeof(deUint32)) == 0);
		DE_ASSERT(m_bufferOp == BUFFER_OP_FILL || m_resource.getBuffer().size <= MAX_UPDATE_BUFFER_SIZE);

		m_data.resize(static_cast<size_t>(m_resource.getBuffer().size));

		if (m_bufferOp == BUFFER_OP_FILL)
		{
			const std::size_t size = m_data.size() / sizeof(m_fillValue);
			deUint32* pData = reinterpret_cast<deUint32*>(&m_data[0]);
			for (deUint32 i = 0; i < size; ++i)
				pData[i] = m_fillValue;
		}
		else if (m_bufferOp == BUFFER_OP_UPDATE)
			fillPattern(&m_data[0], m_data.size());
	}